

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddGroupSiftingBackward(DdManager *table,Move *moves,int size,int upFlag,int lazyFlag)

{
  Move **ppMVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Move *pMVar10;
  DdSubtable *pDVar11;
  int iVar12;
  Move *pMVar13;
  ulong uVar14;
  Move *pMVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  
  if (lazyFlag == 0) {
    pMVar13 = (Move *)0x0;
    pMVar10 = moves;
    if (moves != (Move *)0x0) {
      do {
        if (pMVar10->size < size) {
          size = pMVar10->size;
        }
        ppMVar1 = &pMVar10->next;
        pMVar10 = *ppMVar1;
      } while (*ppMVar1 != (Move *)0x0);
    }
  }
  else {
    if (moves == (Move *)0x0) {
      pMVar13 = (Move *)0x0;
    }
    else {
      pMVar13 = (Move *)0x0;
      pMVar10 = moves;
      do {
        pMVar15 = pMVar13;
        if (pMVar13 == (Move *)0x0) {
          pMVar15 = pMVar10;
        }
        iVar3 = pMVar10->size;
        if (iVar3 != size) {
          pMVar15 = pMVar13;
        }
        pMVar13 = pMVar15;
        if (iVar3 < size) {
          size = iVar3;
          pMVar13 = pMVar10;
        }
        pMVar10 = pMVar10->next;
      } while (pMVar10 != (Move *)0x0);
    }
    if (moves != (Move *)0x0) {
      iVar3 = Cudd_ReadSize(table);
      iVar3 = iVar3 + 1;
      piVar2 = table->perm;
      iVar4 = Cudd_bddReadPairIndex(table,table->invperm[(&moves->x)[upFlag != 1]]);
      uVar8 = piVar2[iVar4];
      pMVar10 = moves;
      do {
        if (pMVar10->size == size) {
          pMVar15 = (Move *)&pMVar10->y;
          if (upFlag == 1) {
            pMVar15 = pMVar10;
          }
          uVar7 = pMVar15->x;
          iVar4 = uVar8 - uVar7;
          if (uVar8 < uVar7) {
            iVar4 = -(uVar8 - uVar7);
          }
          if (iVar4 < iVar3) {
            pMVar13 = pMVar10;
            iVar3 = iVar4;
          }
        }
        pMVar10 = pMVar10->next;
      } while (pMVar10 != (Move *)0x0);
    }
  }
  if (moves != (Move *)0x0) {
    do {
      if (lazyFlag == 0) {
        if (moves->size == size) {
          return 1;
        }
      }
      else if (moves == pMVar13) {
        return 1;
      }
      pDVar11 = table->subtables;
      uVar8 = moves->x;
      uVar17 = (ulong)uVar8;
      if ((pDVar11[uVar17].next == uVar8) && (uVar7 = moves->y, pDVar11[uVar7].next == uVar7)) {
        iVar3 = cuddSwapInPlace(table,uVar8,uVar7);
        if (iVar3 == 0) {
          return 0;
        }
      }
      else {
        uVar7 = moves->y;
        uVar16 = (ulong)uVar7;
        uVar9 = uVar7;
        if (moves->flags == 8) {
          do {
            uVar6 = uVar9;
            uVar9 = pDVar11[(int)uVar6].next;
          } while (uVar6 < uVar9);
          pDVar11[(int)uVar6].next = uVar7;
        }
        else {
          uVar9 = pDVar11[(int)uVar8].next;
          uVar14 = uVar16;
          do {
            uVar6 = (uint)uVar14;
            uVar14 = (ulong)pDVar11[(int)uVar6].next;
          } while (uVar6 < pDVar11[(int)uVar6].next);
          iVar3 = uVar8 - uVar9;
          iVar4 = uVar6 - uVar7;
          if (-1 < iVar4) {
            iVar12 = 1;
            do {
              iVar18 = (uVar8 - uVar9) + 1;
              if (-1 < iVar3) {
                do {
                  iVar5 = cuddSwapInPlace(table,(int)uVar17,(int)uVar16);
                  if (iVar5 == 0) {
                    return 0;
                  }
                  uVar6 = cuddNextLow(table,(int)uVar17);
                  iVar18 = iVar18 + -1;
                  uVar16 = uVar17;
                  uVar17 = (ulong)uVar6;
                } while (iVar18 != 0);
              }
              uVar16 = (ulong)(iVar12 + uVar7);
              uVar6 = cuddNextLow(table,iVar12 + uVar7);
              uVar17 = (ulong)uVar6;
              bVar19 = iVar12 != iVar4 + 1;
              iVar12 = iVar12 + 1;
            } while (bVar19);
          }
          uVar8 = uVar9;
          if (0 < iVar4) {
            do {
              uVar7 = cuddNextHigh(table,uVar8);
              table->subtables[(int)uVar8].next = uVar7;
              uVar8 = cuddNextHigh(table,uVar8);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          table->subtables[(int)uVar8].next = uVar9;
          uVar9 = cuddNextHigh(table,uVar8);
          uVar8 = uVar9;
          if (0 < iVar3) {
            do {
              uVar7 = cuddNextHigh(table,uVar8);
              table->subtables[(int)uVar8].next = uVar7;
              uVar8 = cuddNextHigh(table,uVar8);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          pDVar11 = table->subtables;
        }
        pDVar11[(int)uVar8].next = uVar9;
      }
      moves = moves->next;
    } while (moves != (Move *)0x0);
  }
  return 1;
}

Assistant:

static int
ddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size,
  int  upFlag,
  int  lazyFlag)
{
    Move *move;
    int  res;
    Move *end_move = NULL;
    int diff, tmp_diff;
    int index;
    unsigned int pairlev;

    if (lazyFlag) {
        end_move = NULL;

        /* Find the minimum size, and the earliest position at which it
        ** was achieved. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
                end_move = move;
            } else if (move->size == size) {
                if (end_move == NULL) end_move = move;
            }
        }

        /* Find among the moves that give minimum size the one that
        ** minimizes the distance from the corresponding variable. */
        if (moves != NULL) {
            diff = Cudd_ReadSize(table) + 1;
            index = (upFlag == 1) ?
                    table->invperm[moves->x] : table->invperm[moves->y];
            pairlev =
                (unsigned) table->perm[Cudd_bddReadPairIndex(table, index)];

            for (move = moves; move != NULL; move = move->next) {
                if (move->size == size) {
                    if (upFlag == 1) {
                        tmp_diff = (move->x > pairlev) ?
                                    move->x - pairlev : pairlev - move->x;
                    } else {
                        tmp_diff = (move->y > pairlev) ?
                                    move->y - pairlev : pairlev - move->y;
                    }
                    if (tmp_diff < diff) {
                        diff = tmp_diff;
                        end_move = move;
                    }
                }
            }
        }
    } else {
        /* Find the minimum size. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
            }
        }
    }

    /* In case of lazy sifting, end_move identifies the position at
    ** which we want to stop.  Otherwise, we stop as soon as we meet
    ** the minimum size. */
    for (move = moves; move != NULL; move = move->next) {
        if (lazyFlag) {
            if (move == end_move) return(1);
        } else {
            if (move->size == size) return(1);
        }
        if ((table->subtables[move->x].next == move->x) &&
        (table->subtables[move->y].next == move->y)) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"ddGroupSiftingBackward:\n");
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            if (move->flags == MTR_NEWNODE) {
                ddDissolveGroup(table,(int)move->x,(int)move->y);
            } else {
                res = ddGroupMoveBackward(table,(int)move->x,(int)move->y);
                if (!res) return(0);
            }
        }

    }

    return(1);

}